

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall HPresolve::setBasisElement(HPresolve *this,change c)

{
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar1;
  size_type sVar2;
  reference pvVar3;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  value_type *in_RDI;
  value_type *pvVar4;
  
  this_00 = (vector<int,_std::allocator<int>_> *)((ulong)in_RSI & 0xffffffff);
  switch(this_00) {
  case (vector<int,_std::allocator<int>_> *)0x0:
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_00,(size_type)in_RDI);
    *pvVar1 = 0;
    break;
  case (vector<int,_std::allocator<int>_> *)0x1:
    sVar2 = std::stack<change,_std::deque<change,_std::allocator<change>_>_>::size
                      ((stack<change,_std::deque<change,_std::allocator<change>_>_> *)0x1a98b9);
    if ((sVar2 != 0) &&
       (pvVar3 = std::stack<change,_std::deque<change,_std::allocator<change>_>_>::top
                           ((stack<change,_std::deque<change,_std::allocator<change>_>_> *)0x1a98cf)
       , pvVar3->type != 2)) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_00,(size_type)in_RDI);
      *pvVar1 = 1;
    }
    break;
  case (vector<int,_std::allocator<int>_> *)0x2:
    break;
  case (vector<int,_std::allocator<int>_> *)0x4:
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_00,(size_type)in_RDI);
    *pvVar1 = 0;
    break;
  case (vector<int,_std::allocator<int>_> *)0x5:
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_00,(size_type)in_RDI);
    *pvVar1 = 0;
    break;
  case (vector<int,_std::allocator<int>_> *)0x7:
  case (vector<int,_std::allocator<int>_> *)0x9:
    pvVar4 = in_RDI;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x9c),(long)in_EDX);
    *pvVar1 = 0;
    std::vector<int,_std::allocator<int>_>::push_back(in_RSI,pvVar4);
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_00,(size_type)in_RDI);
    *pvVar1 = 1;
    break;
  case (vector<int,_std::allocator<int>_> *)0x8:
    pvVar4 = in_RDI;
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_00,(size_type)in_RDI);
    *pvVar1 = 0;
    std::vector<int,_std::allocator<int>_>::push_back(in_RSI,pvVar4);
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_00,(size_type)in_RDI);
    *pvVar1 = 1;
    break;
  case (vector<int,_std::allocator<int>_> *)0xa:
  case (vector<int,_std::allocator<int>_> *)0xb:
  case (vector<int,_std::allocator<int>_> *)0xd:
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_00,(size_type)in_RDI);
    *pvVar1 = 1;
    break;
  case (vector<int,_std::allocator<int>_> *)0x15:
  }
  return;
}

Assistant:

void HPresolve::setBasisElement(change c) {

	//nonbasicFlag starts off as [numCol + numRow] and is already
	//increased to [numColOriginal + numRowOriginal] so fill in gaps

	switch (c.type) {
		case EMPTY_ROW: {
			nonbasicFlag.at(numColOriginal + c.row) = 0;
			break;
		}
		case SING_ROW: {
			//elsewhere
			break;
		}
		case FORCING_ROW_VARIABLE:
			// variables set at a bound by forcing row fRjs.p
			// all nonbasic

			break;
		case FORCING_ROW: {
			nonbasicFlag.at(numColOriginal + c.row) = 0;
			break;
		}
		case REDUNDANT_ROW: {
			nonbasicFlag.at(numColOriginal + c.row) = 0;
			break;
		}
		case FREE_SING_COL:
		case IMPLIED_FREE_SING_COL: {
			nonbasicFlag[c.col] = 0;
			basicIndex.push_back(c.col);

			nonbasicFlag.at(numColOriginal + c.row) = 1;
			break;
		}
		case SING_COL_DOUBLETON_INEQ: {
			// column singleton in a doubleton inequality.
			nonbasicFlag.at(c.col) = 0;
			basicIndex.push_back(c.col);

			nonbasicFlag.at(numColOriginal + c.row) = 1;
			break;
		}
		case EMPTY_COL:
		case DOMINATED_COLS:
		case WEAKLY_DOMINATED_COLS: {
			nonbasicFlag.at(c.col) = 1;
			break;
		}
		case FIXED_COL: { //fixed variable:
			//check if it was NOT after singRow
			if (chng.size() > 0)
				if (chng.top().type != SING_ROW)
					nonbasicFlag.at(c.col) = 1;
			break;
		}

	}

}